

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O2

void __thiscall Json::StreamWriterBuilder::StreamWriterBuilder(StreamWriterBuilder *this)

{
  (this->super_Factory)._vptr_Factory = (_func_int **)&PTR__StreamWriterBuilder_00149878;
  Value::Value(&this->settings_,nullValue);
  setDefaults(&this->settings_);
  return;
}

Assistant:

StreamWriterBuilder::StreamWriterBuilder() { setDefaults(&settings_); }